

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall
restincurl::CurlException::CurlException(CurlException *this,string *msg,CURLMcode err)

{
  pointer pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  CURLMcode __val;
  uint __len;
  string __str;
  ulong *local_d0;
  ulong local_c8;
  ulong local_c0 [2];
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_d0 = local_c0;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + msg->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,'\x01');
  __val = -err;
  if (CURLM_OK < err) {
    __val = err;
  }
  __len = 1;
  if (9 < (uint)__val) {
    uVar7 = (ulong)(uint)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0011f08e;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0011f08e;
      }
      if (uVar5 < 10000) goto LAB_0011f08e;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0011f08e:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)(err >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)err >> 0x1f) + (long)local_90),__len,__val);
  uVar7 = 0xf;
  if (local_d0 != local_c0) {
    uVar7 = local_c0[0];
  }
  if (uVar7 < local_88 + local_c8) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if (local_88 + local_c8 <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0011f122;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
LAB_0011f122:
  local_b0 = &local_a0;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_a0 = *plVar4;
    uStack_98 = puVar3[3];
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    uStack_58 = (undefined4)plVar4[3];
    uStack_54 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  curl_multi_strerror(err);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_50);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_0013e968;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_0013e9f0;
  this->err_ = err;
  return;
}

Assistant:

CurlException(const std::string msg, const CURLMcode err)
            : Exception(msg + '(' + std::to_string(err) + "): " + curl_multi_strerror(err))
            , err_{err}
            {}